

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

bool __thiscall
QSpanCollection::cleanSpanSubIndex(QSpanCollection *this,SubIndex *subindex,int y,bool update)

{
  QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>
  *pQVar1;
  iterator it;
  iterator iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  Span *span;
  int local_44;
  Span *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (subindex->d).d.ptr;
  bVar3 = true;
  if ((pQVar1 != (QMapData<std::map<int,_QSpanCollection::Span_*,_std::less<int>,_std::allocator<std::pair<const_int,_QSpanCollection::Span_*>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    it._M_node = (_Base_ptr)QMap<int,_QSpanCollection::Span_*>::end(subindex);
    bVar3 = true;
    do {
      it._M_node = (_Base_ptr)std::_Rb_tree_decrement(it._M_node);
      local_40 = *(Span **)((long)it._M_node + 0x28);
      if (local_40->will_be_deleted == true) {
        it._M_node = (_Base_ptr)
                     QMap<int,_QSpanCollection::Span_*>::erase(subindex,(const_iterator)it._M_node);
      }
      else {
        if ((update) && (local_40->m_left != -*(int *)((long)it._M_node + 0x20))) {
          local_44 = -local_40->m_left;
          QMap<int,_QSpanCollection::Span_*>::insert(subindex,&local_44,&local_40);
          it._M_node = (_Base_ptr)
                       QMap<int,_QSpanCollection::Span_*>::erase
                                 (subindex,(const_iterator)it._M_node);
        }
        if ((bVar3) && (local_40->m_top == y)) {
          bVar3 = false;
        }
      }
      iVar2 = QMap<int,_QSpanCollection::Span_*>::begin(subindex);
    } while ((iterator)it._M_node != iVar2.i._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSpanCollection::cleanSpanSubIndex(QSpanCollection::SubIndex &subindex, int y, bool update)
{
    if (subindex.isEmpty())
        return true;

    bool should_be_deleted = true;
    SubIndex::iterator it = subindex.end();
    do {
        --it;
        int x = -it.key();
        Span *span = it.value();
        if (span->will_be_deleted) {
            it = subindex.erase(it);
            continue;
        }
        if (update && span->m_left != x) {
            subindex.insert(-span->m_left, span);
            it = subindex.erase(it);
        }
        if (should_be_deleted && span->m_top == y)
            should_be_deleted = false;
    } while (it != subindex.begin());

    return should_be_deleted;
}